

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::handleCoopMat2FunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *fnCandidate,TIntermTyped *result,
          TIntermNode *arguments)

{
  value_type pTVar1;
  TIntermediate *this_00;
  TSymbolTable *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar6;
  size_type sVar7;
  reference ppTVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TString *pTVar9;
  undefined4 extraout_var_03;
  TInfoSink *name;
  TSymbol *pTVar10;
  undefined4 extraout_var_04;
  long lVar11;
  undefined4 extraout_var_05;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar12;
  char *pcVar13;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long *plVar15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long *plVar16;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  TType *pTVar17;
  undefined4 extraout_var_22;
  TType *right;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  TArraySizes *pTVar18;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  TQualifier *pTVar19;
  TIntermSymbol *pTVar20;
  TIntermTyped *pTVar21;
  TIntermConstantUnion *pTVar22;
  TConstUnionArray *pTVar23;
  TConstUnion *pTVar24;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined8 uVar25;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined1 local_260 [8];
  TType resultType_1;
  TTypeParameters typeParameters_1;
  uint32_t value_4;
  uint32_t value_3;
  uint32_t value_2;
  TIntermSequence *sequence_2;
  TIntermNode *local_190;
  uint32_t i_5;
  TArraySizes *arraySizes_1;
  TType resultType;
  TTypeParameters typeParameters;
  uint32_t value_1;
  uint32_t value;
  TIntermSequence *sequence_1;
  TIntermNode *local_b8;
  uint32_t i_4;
  TArraySizes *arraySizes;
  TParameter *arg_2;
  int i_3;
  TParameter *matArg;
  TFunction *elemOp;
  TParameter *arg_1;
  int i_2;
  TFunction *combineOp;
  TFunction *decodeFunc;
  TQualifier *formalQualifier;
  TParameter *arg;
  int i_1;
  TFunction *func;
  value_type param;
  uint32_t i;
  TIntermSequence *sequence;
  TIntermNode *arguments_local;
  TIntermTyped *result_local;
  TFunction *fnCandidate_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  name = (TInfoSink *)loc;
  if ((arguments != (TIntermNode *)0x0) &&
     (iVar4 = (*arguments->_vptr_TIntermNode[6])(), CONCAT44(extraout_var,iVar4) != 0)) {
    iVar4 = (*arguments->_vptr_TIntermNode[6])();
    pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 400))();
    for (param._4_4_ = 0;
        sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar6),
        param._4_4_ < sVar7; param._4_4_ = param._4_4_ + 1) {
      name = (TInfoSink *)(ulong)param._4_4_;
      ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (pvVar6,(size_type)name);
      pTVar1 = *ppTVar8;
      iVar4 = (*pTVar1->_vptr_TIntermNode[3])();
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x100))();
      if (iVar4 == 0x16) {
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        name = (this->super_TParseContextBase).super_TParseVersions.infoSink;
        iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
        pTVar9 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x198))();
        TIntermediate::addToCallGraph(this_00,name,&this->currentCaller,pTVar9);
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
        if (((iVar4 == 0x14b) ||
            (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x14e)) ||
           (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x14f)) {
          pTVar2 = (this->super_TParseContextBase).symbolTable;
          iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
          name = (TInfoSink *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x198))();
          pTVar10 = TSymbolTable::find(pTVar2,(TString *)name,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar10->_vptr_TSymbol[7])();
          for (arg._4_4_ = 0;
              iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x120))(),
              (int)arg._4_4_ < iVar5; arg._4_4_ = arg._4_4_ + 1) {
            name = (TInfoSink *)(ulong)arg._4_4_;
            lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x140))();
            lVar11 = (**(code **)(**(long **)(lVar11 + 8) + 0x50))();
            if (((uint)*(undefined8 *)(lVar11 + 8) & 0x7f) != 0x13) {
              iVar5 = (*pTVar1->_vptr_TIntermNode[0xc])();
              pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x198))();
              pcVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(pbVar12);
              name = (TInfoSink *)loc;
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"function parameters must all be qualified \'const in\'",pcVar13,
                         "");
            }
          }
        }
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
        if (iVar4 == 0x14b) {
          pTVar2 = (this->super_TParseContextBase).symbolTable;
          iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
          pTVar9 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x198))();
          pTVar10 = TSymbolTable::find(pTVar2,pTVar9,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar10->_vptr_TSymbol[7])();
          plVar16 = (long *)CONCAT44(extraout_var_07,iVar4);
          iVar4 = (**(code **)(*plVar16 + 0x120))();
          if (iVar4 != 3) {
            iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
            pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x198))();
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar12);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"must have three parameters",pcVar13,"");
          }
          lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,0);
          iVar4 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
          if (iVar4 != 0x12) {
            iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
            pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0x198))();
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar12);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"first parameter must be buffer reference type",pcVar13,"");
          }
          lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,1);
          iVar4 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
          if (iVar4 == 9) {
            lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,2);
            iVar4 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
            if (iVar4 != 9) goto LAB_00758611;
          }
          else {
LAB_00758611:
            iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
            pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x198))();
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar12);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"coordinate parameters must be uint32_t",pcVar13,"");
          }
          lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,1);
          uVar14 = (**(code **)(**(long **)(lVar11 + 8) + 0xe8))();
          if ((uVar14 & 1) != 0) {
            name = (TInfoSink *)0x2;
            lVar11 = (**(code **)(*plVar16 + 0x140))();
            uVar14 = (**(code **)(**(long **)(lVar11 + 8) + 0xe8))();
            if ((uVar14 & 1) != 0) goto LAB_00758703;
          }
          iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
          pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x198))();
          pcVar13 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(pbVar12);
          name = (TInfoSink *)loc;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"coordinate parameters must be uint32_t",pcVar13,"");
        }
LAB_00758703:
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
        if (iVar4 == 0x14e) {
          pTVar2 = (this->super_TParseContextBase).symbolTable;
          iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
          pTVar9 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0x198))();
          pTVar10 = TSymbolTable::find(pTVar2,pTVar9,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar10->_vptr_TSymbol[7])();
          plVar16 = (long *)CONCAT44(extraout_var_13,iVar4);
          iVar4 = (**(code **)(*plVar16 + 0x120))();
          if (iVar4 != 2) {
            iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
            pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar4) + 0x198))();
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar12);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"must have two parameters",pcVar13,"");
          }
          for (arg_1._4_4_ = 0; iVar4 = (**(code **)(*plVar16 + 0x120))(), arg_1._4_4_ < iVar4;
              arg_1._4_4_ = arg_1._4_4_ + 1) {
            lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,arg_1._4_4_);
            ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](pvVar6,1);
            iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
            plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0xf0))();
            iVar4 = (**(code **)(*plVar15 + 0x38))();
            iVar5 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
            if (iVar4 != iVar5) {
              iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
              pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar4) + 0x198))();
              pcVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(pbVar12);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"parameter types must match cooperative matrix component type",
                         pcVar13,"");
            }
          }
          name = (TInfoSink *)0x1;
          ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (pvVar6,1);
          iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
          plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar4) + 0xf0))();
          iVar4 = (**(code **)(*plVar15 + 0x38))();
          plVar16 = (long *)(**(code **)(*plVar16 + 0x60))();
          iVar5 = (**(code **)(*plVar16 + 0x38))();
          if (iVar4 != iVar5) {
            iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
            pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar4) + 0x198))();
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar12);
            name = (TInfoSink *)loc;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"return type must match cooperative matrix component type",pcVar13,
                       "");
          }
        }
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
        if (iVar4 == 0x14f) {
          pTVar2 = (this->super_TParseContextBase).symbolTable;
          iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
          pTVar9 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_19,iVar4) + 0x198))();
          pTVar10 = TSymbolTable::find(pTVar2,pTVar9,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar10->_vptr_TSymbol[7])();
          plVar16 = (long *)CONCAT44(extraout_var_20,iVar4);
          ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (pvVar6,1);
          iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
          pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar4) + 0xf0))();
          ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (pvVar6,0);
          iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
          right = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_22,iVar4) + 0xf0))();
          bVar3 = TType::operator!=(pTVar17,right);
          if (bVar3) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cooperative matrix input and result types must match","");
          }
          iVar4 = (**(code **)(*plVar16 + 0x120))();
          if (iVar4 < 3) {
            iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
            pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar4) + 0x198))();
            pcVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar12);
            name = (TInfoSink *)loc;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"not enough parameters",pcVar13,"");
          }
          else {
            iVar4 = (**(code **)(*plVar16 + 0x120))();
            sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                              (pvVar6);
            if (iVar4 == (int)sVar7) {
              lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,0);
              iVar4 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
              if (iVar4 == 9) {
                lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,1);
                iVar4 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
                if (iVar4 != 9) goto LAB_00758b99;
              }
              else {
LAB_00758b99:
                iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
                pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar4) + 0x198))();
                pcVar13 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(pbVar12);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"row/column parameters must be uint32_t",pcVar13,"");
              }
              lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,2);
              ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](pvVar6,1);
              iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
              plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_26,iVar4) + 0xf0))();
              iVar4 = (**(code **)(*plVar15 + 0x38))();
              iVar5 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
              if (iVar4 != iVar5) {
                iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
                pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)CONCAT44(extraout_var_27,iVar4) + 0x198))();
                pcVar13 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(pbVar12);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"third parameter must match cooperative matrix component type",
                           pcVar13,"");
              }
              for (arg_2._4_4_ = 3; iVar4 = (**(code **)(*plVar16 + 0x120))(), arg_2._4_4_ < iVar4;
                  arg_2._4_4_ = arg_2._4_4_ + 1) {
                lVar11 = (**(code **)(*plVar16 + 0x140))(plVar16,arg_2._4_4_);
                ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                          operator[](pvVar6,(long)arg_2._4_4_);
                iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
                plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_28,iVar4) + 0xf0))();
                iVar4 = (**(code **)(*plVar15 + 0x38))();
                iVar5 = (**(code **)(**(long **)(lVar11 + 8) + 0x38))();
                if (iVar4 != iVar5) {
                  iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
                  pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(*(long *)CONCAT44(extraout_var_29,iVar4) + 0x198))();
                  pcVar13 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str(pbVar12);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,
                             "parameter types must match or be cooperative matrix component type",
                             pcVar13,"");
                }
              }
              name = (TInfoSink *)0x1;
              ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](pvVar6,1);
              iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
              plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar4) + 0xf0))();
              iVar4 = (**(code **)(*plVar15 + 0x38))();
              plVar16 = (long *)(**(code **)(*plVar16 + 0x60))();
              iVar5 = (**(code **)(*plVar16 + 0x38))();
              if (iVar4 != iVar5) {
                iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
                pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)CONCAT44(extraout_var_31,iVar4) + 0x198))();
                pcVar13 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(pbVar12);
                name = (TInfoSink *)loc;
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"return type must match cooperative matrix component type",
                           pcVar13,"");
              }
            }
            else {
              iVar4 = (*pTVar1->_vptr_TIntermNode[0xc])();
              pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)CONCAT44(extraout_var_24,iVar4) + 0x198))();
              pcVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(pbVar12);
              name = (TInfoSink *)loc;
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"number of parameters must match call to coopMatPerElementNV",
                         pcVar13,"");
            }
          }
        }
      }
    }
  }
  iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])();
  pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_32,iVar4) + 0xf0))();
  bVar3 = TType::isCoopMat(pTVar17);
  if (!bVar3) {
    iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])();
    pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_33,iVar4) + 0xf0))();
    bVar3 = TType::isTensorLayoutNV(pTVar17);
    if (!bVar3) {
      iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])();
      pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_34,iVar4) + 0xf0))();
      bVar3 = TType::isTensorViewNV(pTVar17);
      if (!bVar3) {
        return;
      }
    }
  }
  iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])();
  plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_35,iVar4) + 0xf0))();
  uVar14 = (**(code **)(*plVar16 + 0x188))();
  if ((uVar14 & 1) == 0) {
    iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
    bVar3 = true;
    if (iVar4 != 0x148) {
      iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
      bVar3 = true;
      if (iVar4 != 0x14d) {
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
        bVar3 = true;
        if (iVar4 != 0x14e) {
          iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
          bVar3 = true;
          if (iVar4 != 0x14f) {
            iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
            bVar3 = true;
            if (iVar4 != 0x150) {
              iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
              bVar3 = true;
              if (iVar4 != 0x151) {
                iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                bVar3 = true;
                if (iVar4 != 0x153) {
                  iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                  bVar3 = true;
                  if (iVar4 != 0x152) {
                    iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                    bVar3 = true;
                    if (iVar4 != 0x154) {
                      iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                      bVar3 = true;
                      if (iVar4 != 0x155) {
                        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                        bVar3 = true;
                        if (iVar4 != 0x156) {
                          iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                          bVar3 = true;
                          if (iVar4 != 0x157) {
                            iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                            bVar3 = true;
                            if (iVar4 != 0x158) {
                              iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                              bVar3 = true;
                              if (iVar4 != 0x159) {
                                iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
                                bVar3 = iVar4 == 0x15a;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (!bVar3) {
      __assert_fail("fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV || fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV || fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x672,
                    "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                   );
    }
    iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
    if (iVar4 == 0x151) {
      pTVar18 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)name);
      TArraySizes::TArraySizes(pTVar18);
      for (local_b8._4_4_ = 0; local_b8._4_4_ < 2; local_b8._4_4_ = local_b8._4_4_ + 1) {
        sequence_1 = (TIntermSequence *)0x0;
        iVar4 = (*arguments->_vptr_TIntermNode[5])();
        if (CONCAT44(extraout_var_36,iVar4) == 0) {
          iVar4 = (*arguments->_vptr_TIntermNode[6])();
          if (CONCAT44(extraout_var_37,iVar4) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x67f,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar4 = (*arguments->_vptr_TIntermNode[6])();
          pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_38,iVar4) + 400))();
          sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar6);
          if (local_b8._4_4_ < sVar7) {
            ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                      operator[](pvVar6,(ulong)local_b8._4_4_);
            sequence_1 = (TIntermSequence *)*ppTVar8;
          }
        }
        else if (local_b8._4_4_ == 0) {
          sequence_1 = (TIntermSequence *)arguments;
        }
        if (sequence_1 == (TIntermSequence *)0x0) {
          TArraySizes::addInnerSize(pTVar18,0);
        }
        else {
          plVar16 = (long *)(*(code *)((sequence_1->
                                       super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                       ).
                                       super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                       ._M_impl.super__Tp_alloc_type.allocator)->headerSkip)();
          plVar16 = (long *)(**(code **)(*plVar16 + 0xf0))();
          pTVar19 = (TQualifier *)(**(code **)(*plVar16 + 0x58))();
          bVar3 = TQualifier::isSpecConstant(pTVar19);
          if (bVar3) {
            pTVar20 = (TIntermSymbol *)
                      (*(code *)(sequence_1->
                                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                ).
                                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator[1].pageSize)();
            pTVar23 = TIntermSymbol::getConstArray(pTVar20);
            pTVar24 = TConstUnionArray::operator[](pTVar23,0);
            iVar4 = TConstUnion::getIConst(pTVar24);
            pTVar21 = (TIntermTyped *)
                      (*(code *)((sequence_1->
                                 super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ).
                                 super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ._M_impl.super__Tp_alloc_type.allocator)->headerSkip)();
            TArraySizes::addInnerSize(pTVar18,iVar4,pTVar21);
          }
          else {
            pTVar22 = (TIntermConstantUnion *)
                      (*(code *)((sequence_1->
                                 super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ).
                                 super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ._M_impl.super__Tp_alloc_type.allocator)->freeList)();
            pTVar23 = TIntermConstantUnion::getConstArray(pTVar22);
            pTVar24 = TConstUnionArray::operator[](pTVar23,0);
            iVar4 = TConstUnion::getIConst(pTVar24);
            TArraySizes::addInnerSize(pTVar18,iVar4);
          }
        }
      }
      TTypeParameters::TTypeParameters((TTypeParameters *)&resultType.spirvType);
      TType::TType((TType *)&arraySizes_1,EbtVoid,EvqTemporary,1,0,0,false);
      iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])();
      pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_39,iVar4) + 0xf0))();
      TType::deepCopy((TType *)&arraySizes_1,pTVar17);
      TType::copyTypeParameters((TType *)&arraySizes_1,(TTypeParameters *)&resultType.spirvType);
      (*(result->super_TIntermNode)._vptr_TIntermNode[0x1d])(result,&arraySizes_1);
      TType::~TType((TType *)&arraySizes_1);
    }
    else {
      iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
      if (iVar4 == 0x157) {
        pTVar18 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)name);
        TArraySizes::TArraySizes(pTVar18);
        for (local_190._4_4_ = 0; local_190._4_4_ < 7; local_190._4_4_ = local_190._4_4_ + 1) {
          sequence_2 = (TIntermSequence *)0x0;
          iVar4 = (*arguments->_vptr_TIntermNode[5])();
          if (CONCAT44(extraout_var_40,iVar4) == 0) {
            iVar4 = (*arguments->_vptr_TIntermNode[6])();
            if (CONCAT44(extraout_var_41,iVar4) == 0) {
              __assert_fail("arguments->getAsAggregate()",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                            ,0x6a5,
                            "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                           );
            }
            iVar4 = (*arguments->_vptr_TIntermNode[6])();
            pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     (**(code **)(*(long *)CONCAT44(extraout_var_42,iVar4) + 400))();
            sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                              (pvVar6);
            if (local_190._4_4_ < sVar7) {
              ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](pvVar6,(ulong)local_190._4_4_);
              sequence_2 = (TIntermSequence *)*ppTVar8;
            }
          }
          else if (local_190._4_4_ == 0) {
            sequence_2 = (TIntermSequence *)arguments;
          }
          if (sequence_2 == (TIntermSequence *)0x0) {
            typeParameters_1.spirvType._4_4_ = 0;
            if (1 < local_190._4_4_) {
              typeParameters_1.spirvType._4_4_ = local_190._4_4_ - 2;
            }
            TArraySizes::addInnerSize(pTVar18,typeParameters_1.spirvType._4_4_);
          }
          else {
            plVar16 = (long *)(*(code *)((sequence_2->
                                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                         ).
                                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                         ._M_impl.super__Tp_alloc_type.allocator)->headerSkip)();
            plVar16 = (long *)(**(code **)(*plVar16 + 0xf0))();
            pTVar19 = (TQualifier *)(**(code **)(*plVar16 + 0x58))();
            bVar3 = TQualifier::isSpecConstant(pTVar19);
            if (bVar3) {
              pTVar20 = (TIntermSymbol *)
                        (*(code *)(sequence_2->
                                  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                  ).
                                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                  ._M_impl.super__Tp_alloc_type.allocator[1].pageSize)();
              pTVar23 = TIntermSymbol::getConstArray(pTVar20);
              pTVar24 = TConstUnionArray::operator[](pTVar23,0);
              iVar4 = TConstUnion::getIConst(pTVar24);
              pTVar21 = (TIntermTyped *)
                        (*(code *)((sequence_2->
                                   super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                   ).
                                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                   ._M_impl.super__Tp_alloc_type.allocator)->headerSkip)();
              TArraySizes::addInnerSize(pTVar18,iVar4,pTVar21);
            }
            else {
              pTVar22 = (TIntermConstantUnion *)
                        (*(code *)((sequence_2->
                                   super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                   ).
                                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                   ._M_impl.super__Tp_alloc_type.allocator)->freeList)();
              pTVar23 = TIntermConstantUnion::getConstArray(pTVar22);
              pTVar24 = TConstUnionArray::operator[](pTVar23,0);
              iVar4 = TConstUnion::getIConst(pTVar24);
              TArraySizes::addInnerSize(pTVar18,iVar4);
            }
          }
        }
        TTypeParameters::TTypeParameters((TTypeParameters *)&resultType_1.spirvType);
        TType::TType((TType *)local_260,EbtVoid,EvqTemporary,1,0,0,false);
        iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])();
        pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_43,iVar4) + 0xf0))();
        TType::deepCopy((TType *)local_260,pTVar17);
        TType::copyTypeParameters((TType *)local_260,(TTypeParameters *)&resultType_1.spirvType);
        (*(result->super_TIntermNode)._vptr_TIntermNode[0x1d])(result,local_260);
        TType::~TType((TType *)local_260);
      }
      else {
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])();
        if (((((iVar4 == 0x14e) ||
              (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x14f)) ||
             ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x150 ||
              ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x153 ||
               (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x152))))))
            || (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x154)) ||
           ((((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x155 ||
              (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x156)) ||
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x158)) ||
            ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x159 ||
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(), iVar4 == 0x15a)))))) {
          iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])();
          pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_44,iVar4) + 400))();
          ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (pvVar6,0);
          iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
          uVar25 = (**(code **)(*(long *)CONCAT44(extraout_var_45,iVar4) + 0xf0))();
          (*(result->super_TIntermNode)._vptr_TIntermNode[0x1d])(result,uVar25);
        }
        else {
          iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])();
          pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_46,iVar4) + 400))();
          ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (pvVar6,2);
          iVar4 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
          uVar25 = (**(code **)(*(long *)CONCAT44(extraout_var_47,iVar4) + 0xf0))();
          (*(result->super_TIntermNode)._vptr_TIntermNode[0x1d])(result,uVar25);
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::handleCoopMat2FunctionCall(const TSourceLoc& loc, const TFunction* fnCandidate, TIntermTyped* result, TIntermNode* arguments)
{
    if (arguments && arguments->getAsAggregate()) {
        auto &sequence = arguments->getAsAggregate()->getSequence();
        for (uint32_t i = 0; i < sequence.size(); ++i) {
            auto param = sequence[i];
            if (param->getAsTyped()->getBasicType() == EbtFunction) {
                // Add the function to the callgraph
                intermediate.addToCallGraph(infoSink, currentCaller, param->getAsSymbolNode()->getMangledName());

                // error checking that all parameters are 'const in'
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* func = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();
                    for (int i = 0; i < func->getParamCount(); ++i) {
                        const TParameter& arg = (*func)[i];
                        const TQualifier& formalQualifier = arg.type->getQualifier();
                        if (formalQualifier.storage != EvqConstReadOnly) {
                            error(loc, "function parameters must all be qualified 'const in'", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }

                // error checking decodeFunc parameters are (reference, uint32_t[], uint32_t[])
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV) {
                    const TFunction* decodeFunc = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (decodeFunc->getParamCount() != 3) {
                        error(loc, "must have three parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    if ((*decodeFunc)[0].type->getBasicType() != EbtReference) {
                        error(loc, "first parameter must be buffer reference type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if ((*decodeFunc)[1].type->getBasicType() != EbtUint || (*decodeFunc)[2].type->getBasicType() != EbtUint) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if (!(*decodeFunc)[1].type->isArray() || !(*decodeFunc)[2].type->isArray()) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking reduce function has matching parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV) {
                    const TFunction* combineOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (combineOp->getParamCount() != 2) {
                        error(loc, "must have two parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    for (int i = 0; i < combineOp->getParamCount(); ++i) {
                        const TParameter& arg = (*combineOp)[i];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                            error(loc, "parameter types must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                    if (sequence[1]->getAsTyped()->getType().getBasicType() != combineOp->getType().getBasicType()) {
                        error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking perelement op has correct parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* elemOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (sequence[1]->getAsTyped()->getType() != sequence[0]->getAsTyped()->getType()) {
                        error(loc, "cooperative matrix input and result types must match", "", "");
                    }

                    if (elemOp->getParamCount() < 3) {
                        error(loc, "not enough parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else if (elemOp->getParamCount() != (int)sequence.size()) {
                        error(loc, "number of parameters must match call to coopMatPerElementNV", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else {
                        if ((*elemOp)[0].type->getBasicType() != EbtUint || (*elemOp)[1].type->getBasicType() != EbtUint) {
                            error(loc, "row/column parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        const TParameter& matArg = (*elemOp)[2];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != matArg.type->getBasicType()) {
                            error(loc, "third parameter must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        for (int i = 3; i < elemOp->getParamCount(); ++i) {
                            const TParameter& arg = (*elemOp)[i];
                            if (sequence[i]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                                error(loc, "parameter types must match or be cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                            }
                        }
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != elemOp->getType().getBasicType()) {
                            error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }
            }
        }
    }
    if ((result->getAsTyped()->getType().isCoopMat() ||
         result->getAsTyped()->getType().isTensorLayoutNV() ||
         result->getAsTyped()->getType().isTensorViewNV()) &&
       !result->getAsTyped()->getType().isParameterized()) {
        assert(fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV);

        if (fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 2; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    // gl_CooperativeMatrixClampModeUndefined
                    arraySizes->addInnerSize(0);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 7; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    uint32_t value = 0;
                    if (i >= 2) {
                        // default permutation values are an increasing sequence
                        value = i - 2;
                    }
                    arraySizes->addInnerSize(value);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV) {
            // Set result type to match type of first parameter
            result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
        } else {
            // For MulAdd, set result type to match type of C parameter
            result->setType(result->getAsAggregate()->getSequence()[2]->getAsTyped()->getType());
        }
    }
}